

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_templates.h
# Opt level: O0

void __thiscall UniqueList<secplane_t>::Clear(UniqueList<secplane_t> *this)

{
  uint uVar1;
  secplane_t **ppsVar2;
  uint local_14;
  uint i;
  UniqueList<secplane_t> *this_local;
  
  local_14 = 0;
  while( true ) {
    uVar1 = TArray<secplane_t_*,_secplane_t_*>::Size(&this->Array);
    if (uVar1 <= local_14) break;
    ppsVar2 = TArray<secplane_t_*,_secplane_t_*>::operator[](&this->Array,(ulong)local_14);
    FreeList<secplane_t>::Release((FreeList<secplane_t> *)&this->field_0x10,*ppsVar2);
    local_14 = local_14 + 1;
  }
  TArray<secplane_t_*,_secplane_t_*>::Clear(&this->Array);
  return;
}

Assistant:

void Clear()
	{
		for(unsigned i=0;i<Array.Size();i++) TheFreeList.Release(Array[i]);
		Array.Clear();
	}